

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_expression.cpp
# Opt level: O2

void duckdb::BoundParameterExpression::Invalidate(Expression *expr)

{
  BoundParameterExpression *pBVar1;
  BoundParameterData *pBVar2;
  InternalException *this;
  allocator local_39;
  string local_38;
  
  if ((expr->super_BaseExpression).type == VALUE_PARAMETER) {
    pBVar1 = BaseExpression::Cast<duckdb::BoundParameterExpression>(&expr->super_BaseExpression);
    LogicalType::LogicalType((LogicalType *)&local_38,SQLNULL);
    LogicalType::operator=(&(pBVar1->super_Expression).return_type,(LogicalType *)&local_38);
    LogicalType::~LogicalType((LogicalType *)&local_38);
    LogicalType::LogicalType((LogicalType *)&local_38,INVALID);
    pBVar2 = shared_ptr<duckdb::BoundParameterData,_true>::operator->(&pBVar1->parameter_data);
    LogicalType::operator=(&pBVar2->return_type,(LogicalType *)&local_38);
    LogicalType::~LogicalType((LogicalType *)&local_38);
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "BoundParameterExpression::Invalidate requires a parameter as input",&local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BoundParameterExpression::Invalidate(Expression &expr) {
	if (expr.GetExpressionType() != ExpressionType::VALUE_PARAMETER) {
		throw InternalException("BoundParameterExpression::Invalidate requires a parameter as input");
	}
	auto &bound_parameter = expr.Cast<BoundParameterExpression>();
	bound_parameter.return_type = LogicalTypeId::SQLNULL;
	bound_parameter.parameter_data->return_type = LogicalTypeId::INVALID;
}